

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdPrecompute4Vars(void)

{
  int iVar1;
  char *pcVar2;
  uint local_148;
  uint local_144;
  int Counter2;
  int Counter1;
  int RetValue;
  int i;
  char Buffer [256];
  uint *pTruthC;
  FILE *pFStack_28;
  uint uTruth;
  FILE *pFile;
  Kit_DsdNtk_t *pTemp;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdMan_t *p;
  
  local_144 = 0;
  local_148 = 0;
  pFStack_28 = fopen("5npn/npn4.txt","r");
  Counter1 = 0;
  while( true ) {
    pcVar2 = fgets((char *)&RetValue,100,pFStack_28);
    if (pcVar2 == (char *)0x0) break;
    i._2_1_ = 0;
    Extra_ReadHexadecimal((uint *)((long)&pTruthC + 4),(char *)((long)&RetValue + 2),4);
    pTruthC._4_4_ = pTruthC._4_4_ << 0x10 | pTruthC._4_4_ & 0xffff;
    pFile = (FILE *)Kit_DsdDecompose((uint *)((long)&pTruthC + 4),4);
    pTemp = (Kit_DsdNtk_t *)pFile;
    pTemp = Kit_DsdExpand((Kit_DsdNtk_t *)pFile);
    Kit_DsdNtkFree((Kit_DsdNtk_t *)pFile);
    iVar1 = Kit_DsdFindLargeBox(pTemp,3);
    if (iVar1 != 0) {
      iVar1 = Kit_DsdTestCofs(pTemp,(uint *)((long)&pTruthC + 4));
      printf("\n");
      pcVar2 = "";
      if (iVar1 != 0) {
        pcVar2 = "implementable";
      }
      printf("%3d : Non-DSD function  %s  %s\n",(ulong)(uint)Counter1,(long)&RetValue + 2,pcVar2);
      Kit_DsdPrint(_stdout,pTemp);
      printf("\n");
      local_144 = local_144 + 1;
      local_148 = iVar1 + local_148;
    }
    iVar1 = Kit_DsdNtkObjNum(pTemp);
    pNtk = (Kit_DsdNtk_t *)Kit_DsdManAlloc(4,iVar1);
    Buffer._248_8_ = Kit_DsdTruthCompute((Kit_DsdMan_t *)pNtk,pTemp);
    iVar1 = Extra_TruthIsEqual((uint *)((long)&pTruthC + 4),(uint *)Buffer._248_8_,4);
    if (iVar1 == 0) {
      printf("Verification failed.\n");
    }
    Kit_DsdManFree((Kit_DsdMan_t *)pNtk);
    Kit_DsdNtkFree(pTemp);
    Counter1 = Counter1 + 1;
  }
  fclose(pFStack_28);
  printf("non-DSD = %d   implementable = %d\n",(ulong)local_144,(ulong)local_148);
  return;
}

Assistant:

void Kit_DsdPrecompute4Vars()
{
    Kit_DsdMan_t * p;
    Kit_DsdNtk_t * pNtk, * pTemp;
    FILE * pFile;
    unsigned uTruth;
    unsigned * pTruthC;
    char Buffer[256];
    int i, RetValue;
    int Counter1 = 0, Counter2 = 0;

    pFile = fopen( "5npn/npn4.txt", "r" );
    for ( i = 0; fgets( Buffer, 100, pFile ); i++ )
    {
        Buffer[6] = 0;
        Extra_ReadHexadecimal( &uTruth, Buffer+2, 4 );
        uTruth = ((uTruth & 0xffff) << 16) | (uTruth & 0xffff);
        pNtk = Kit_DsdDecompose( &uTruth, 4 );

        pNtk = Kit_DsdExpand( pTemp = pNtk );
        Kit_DsdNtkFree( pTemp );


        if ( Kit_DsdFindLargeBox(pNtk, 3) )
        {
//            RetValue = 0;
            RetValue = Kit_DsdTestCofs( pNtk, &uTruth );
            printf( "\n" );
            printf( "%3d : Non-DSD function  %s  %s\n", i, Buffer + 2, RetValue? "implementable" : "" );
            Kit_DsdPrint( stdout, pNtk ), printf( "\n" );

            Counter1++;
            Counter2 += RetValue;
        }

/*
        printf( "%3d : Function  %s   ", i, Buffer + 2 );
        if ( !Kit_DsdFindLargeBox(pNtk, 3) )
            Kit_DsdPrint( stdout, pNtk );
        else
            printf( "\n" );
*/

        p = Kit_DsdManAlloc( 4, Kit_DsdNtkObjNum(pNtk) );
        pTruthC = Kit_DsdTruthCompute( p, pNtk );
        if ( !Extra_TruthIsEqual( &uTruth, pTruthC, 4 ) )
            printf( "Verification failed.\n" );
        Kit_DsdManFree( p );

        Kit_DsdNtkFree( pNtk );
    }
    fclose( pFile );
    printf( "non-DSD = %d   implementable = %d\n", Counter1, Counter2 );
}